

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

node * make_tree(float32 **means,float32 **vars,float32 ***mixw,int32 *phnids,int32 nphones,
                int32 ndensity,int32 nfeat,int32 dim,int32 npermute,int32 depth,int32 continuous)

{
  float32 **means_00;
  float32 **vars_00;
  float32 ***mixw_00;
  int32 iVar1;
  cmd_ln_t *cmdln;
  ulong uVar2;
  node *sroot;
  int32 **lists;
  int32 *llist;
  node *pnVar3;
  size_t d1;
  int iVar4;
  ulong uVar5;
  float32 fVar6;
  int32 nrclass;
  int32 nlclass;
  float32 **local_78;
  float32 **local_70;
  float32 ***local_68;
  node_str **local_60;
  size_t local_58;
  ulong local_50;
  int32 *local_48;
  int32 *rclass;
  int32 *lclass;
  
  cmdln = cmd_ln_get();
  uVar2 = cmd_ln_int_r(cmdln,"-niter");
  local_78 = means;
  local_70 = vars;
  local_68 = mixw;
  sroot = make_simple_tree(means,vars,mixw,phnids,nphones,ndensity,nfeat,dim,npermute,depth,
                           continuous);
  d1 = (size_t)npermute;
  local_60 = &sroot->left;
  local_50 = (ulong)(depth + 1);
  uVar5 = 0;
  if (0 < (int)uVar2) {
    uVar5 = uVar2 & 0xffffffff;
  }
  local_58 = d1;
  while (iVar4 = (int)uVar5, uVar5 = (ulong)(iVar4 - 1), iVar4 != 0) {
    lists = (int32 **)
            __ckd_calloc_2d__(d1,(long)nphones,4,
                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/make_quests/main.c"
                              ,0x293);
    llist = (int32 *)__ckd_calloc__(d1,4,
                                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/make_quests/main.c"
                                    ,0x294);
    iVar1 = pare_tree(sroot,(int32)d1,lists,llist);
    if (iVar1 < 2) {
      *local_60 = (node_str *)0x0;
      local_60[1] = (node_str *)0x0;
    }
    else {
      fVar6 = permute(local_78,local_70,local_68,ndensity,nfeat,dim,lists,llist,iVar1,&lclass,
                      &rclass,&nlclass,&nrclass,continuous);
      free_tree(sroot->left);
      free_tree(sroot->right);
      mixw_00 = local_68;
      vars_00 = local_70;
      means_00 = local_78;
      sroot->lkhd_dec = fVar6;
      iVar1 = (int32)local_50;
      local_48 = llist;
      pnVar3 = make_tree(local_78,local_70,local_68,lclass,nlclass,ndensity,nfeat,dim,npermute,iVar1
                         ,continuous);
      llist = local_48;
      d1 = local_58;
      sroot->left = pnVar3;
      pnVar3 = make_tree(means_00,vars_00,mixw_00,rclass,nrclass,ndensity,nfeat,dim,npermute,iVar1,
                         continuous);
      sroot->right = pnVar3;
    }
    ckd_free_2d(lists);
    ckd_free(llist);
  }
  return sroot;
}

Assistant:

node  *make_tree (float32 **means, float32 **vars, float32 ***mixw,
           int32 *phnids, int32 nphones, int32 ndensity, int32 nfeat,
           int32 dim, int32 npermute, int32 depth, int32 continuous)
{
    float32 lkhddec;
    int32 niter,iter,jpermute, **lists, *llists;
    int32 *lclass, nlclass, *rclass, nrclass;
    node *sroot;

    niter = cmd_ln_int32("-niter");

    sroot = make_simple_tree(means,vars,mixw,phnids,nphones,ndensity,nfeat,dim,npermute,depth, continuous);
    for (iter = 0; iter < niter; iter++) {
        /* overallocate lists of lists */
        lists = (int32 **) ckd_calloc_2d(npermute,nphones,sizeof(int32));
        llists = (int32 *) ckd_calloc(npermute,sizeof(int32));

        jpermute = pare_tree(sroot,npermute,lists,llists);
        if (jpermute > 1){
            lkhddec = permute(means,vars,mixw,ndensity,nfeat,dim,lists,llists,
                                   jpermute,&lclass,&rclass,&nlclass,&nrclass, continuous);
            free_tree(sroot->left); free_tree(sroot->right);
            sroot->lkhd_dec = lkhddec;
            sroot->left = 
                make_tree(means,vars,mixw,lclass,nlclass,ndensity,nfeat,
                          dim,npermute,depth+1, continuous);
            sroot->right = 
                make_tree(means,vars,mixw,rclass,nrclass,ndensity,nfeat,
                          dim,npermute,depth+1, continuous);
        }
        else { sroot->left = sroot->right = NULL; }
        ckd_free_2d((void **)lists); ckd_free(llists);
    }
    return(sroot);
}